

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_FraigRefineClasses(Ivy_FraigMan_t *p)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  Ivy_Obj_t *local_48;
  Ivy_Obj_t *local_40;
  abctime clk;
  int Counter;
  int RetValue;
  Ivy_Obj_t *pClass2;
  Ivy_Obj_t *pClass;
  Ivy_FraigMan_t *p_local;
  
  clk._0_4_ = 0;
  if (p->pParams->fProve != 0) {
    Ivy_FraigCheckOutputSims(p);
  }
  if (p->pManFraig->pData == (void *)0x0) {
    aVar2 = Abc_Clock();
    pClass2 = (p->lClasses).pHead;
    if (pClass2 == (Ivy_Obj_t *)0x0) {
      local_40 = (Ivy_Obj_t *)0x0;
    }
    else {
      local_40 = Ivy_ObjEquivListNext(pClass2);
    }
    _Counter = local_40;
    while (pClass2 != (Ivy_Obj_t *)0x0) {
      if ((*(uint *)&pClass2->field_0x8 >> 4 & 1) == 0) {
        iVar1 = Ivy_FraigRefineClass_rec(p,pClass2);
        clk._0_4_ = (uint)(0 < iVar1) + (int)clk;
      }
      pClass2 = _Counter;
      if (_Counter == (Ivy_Obj_t *)0x0) {
        local_48 = (Ivy_Obj_t *)0x0;
      }
      else {
        local_48 = Ivy_ObjEquivListNext(_Counter);
      }
      _Counter = local_48;
    }
    aVar3 = Abc_Clock();
    p->timeRef = (aVar3 - aVar2) + p->timeRef;
    p_local._4_4_ = (int)clk;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_FraigRefineClasses( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pClass, * pClass2;
    int RetValue, Counter = 0;
    abctime clk;
    // check if some outputs already became non-constant
    // this is a special case when computation can be stopped!!!
    if ( p->pParams->fProve )
        Ivy_FraigCheckOutputSims( p );
    if ( p->pManFraig->pData )
        return 0;
    // refine the classed
clk = Abc_Clock();
    Ivy_FraigForEachEquivClassSafe( p->lClasses.pHead, pClass, pClass2 )
    {
        if ( pClass->fMarkA )
            continue;
        RetValue = Ivy_FraigRefineClass_rec( p, pClass );
        Counter += ( RetValue > 0 );
//if ( Ivy_ObjIsConst1(pClass) )
//printf( "%d ", RetValue );
//if ( Ivy_ObjIsConst1(pClass) )
//    p->time1 += Abc_Clock() - clk;
    }
p->timeRef += Abc_Clock() - clk;
    return Counter;
}